

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RestraintForceModifier.cpp
# Opt level: O1

RealType __thiscall
OpenMD::RestraintForceModifier::doRestraints(RestraintForceModifier *this,RealType scalingFactor)

{
  long *plVar1;
  undefined8 *puVar2;
  double dVar3;
  _Rb_tree<int,_std::pair<const_int,_std::pair<double,_double>_>,_std::_Select1st<std::pair<const_int,_std::pair<double,_double>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<double,_double>_>_>_>
  *p_Var4;
  _Rb_tree<int,_std::pair<const_int,_std::pair<double,_double>_>,_std::_Select1st<std::pair<const_int,_std::pair<double,_double>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<double,_double>_>_>_>
  *p_Var5;
  Snapshot *pSVar6;
  Atom **ppAVar7;
  undefined1 auVar8 [8];
  Atom **ppAVar9;
  Atom *pAVar10;
  uint i_2;
  long lVar11;
  Molecule *pMVar12;
  StuntDouble *pSVar13;
  string *psVar14;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  ObjectRestraint *this_01;
  uint i;
  long lVar15;
  _Rb_tree<int,_std::pair<const_int,_std::pair<double,_double>_>,_std::_Select1st<std::pair<const_int,_std::pair<double,_double>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<double,_double>_>_>_>
  *this_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var16;
  pointer ppSVar17;
  long lVar18;
  RotMat3x3d *pRVar19;
  pointer ppMVar20;
  byte bVar21;
  Vector3d molCom;
  RotMat3x3d A;
  vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> struc;
  MolecularRestraint *local_1c8;
  undefined1 local_1b8 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_1b0;
  pointer local_1a8;
  Atom **local_198;
  pointer ppBStack_190;
  Atom *local_188;
  _Base_ptr local_180;
  _Base_ptr p_Stack_178;
  pointer local_170;
  RestraintForceModifier *local_150;
  pointer local_148 [3];
  pointer local_130;
  vector<std::map<int,_std::pair<double,_double>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<double,_double>_>_>_>,_std::allocator<std::map<int,_std::pair<double,_double>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<double,_double>_>_>_>_>_>
  *local_128;
  _Rb_tree<int,_std::pair<const_int,_std::pair<double,_double>_>,_std::_Select1st<std::pair<const_int,_std::pair<double,_double>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<double,_double>_>_>_>
  local_120;
  vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> local_f0;
  Vector3d local_d8;
  Vector3d local_b8;
  Vector3d local_98;
  RotMat3x3d local_78;
  
  bVar21 = 0;
  local_120._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_120._M_impl.super__Rb_tree_header._M_header;
  local_120._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_120._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_120._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->unscaledPotential_ = 0.0;
  p_Var4 = &((this->restInfo_).
             super__Vector_base<std::map<int,_std::pair<double,_double>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<double,_double>_>_>_>,_std::allocator<std::map<int,_std::pair<double,_double>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<double,_double>_>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->_M_t;
  p_Var5 = &((this->restInfo_).
             super__Vector_base<std::map<int,_std::pair<double,_double>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<double,_double>_>_>_>,_std::allocator<std::map<int,_std::pair<double,_double>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<double,_double>_>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish)->_M_t;
  this_02 = p_Var4;
  local_130 = (pointer)scalingFactor;
  local_120._M_impl.super__Rb_tree_header._M_header._M_right =
       local_120._M_impl.super__Rb_tree_header._M_header._M_left;
  if (p_Var5 != p_Var4) {
    do {
      std::
      _Rb_tree<int,_std::pair<const_int,_std::pair<double,_double>_>,_std::_Select1st<std::pair<const_int,_std::pair<double,_double>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<double,_double>_>_>_>
      ::~_Rb_tree(this_02);
      this_02 = this_02 + 1;
    } while (this_02 != p_Var5);
    (this->restInfo_).
    super__Vector_base<std::map<int,_std::pair<double,_double>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<double,_double>_>_>_>,_std::allocator<std::map<int,_std::pair<double,_double>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<double,_double>_>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)p_Var4;
  }
  local_128 = &this->restInfo_;
  ppMVar20 = (this->restrainedMols_).
             super__Vector_base<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  local_150 = this;
  if (ppMVar20 ==
      (this->restrainedMols_).
      super__Vector_base<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  else {
    local_1c8 = (MolecularRestraint *)0x0;
    p_Var16 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    do {
      pMVar12 = *ppMVar20;
      local_198 = &local_188;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_198,"Restraint","");
      Molecule::getPropertyByName((Molecule *)local_1b8,(string *)pMVar12);
      this_00 = p_Stack_1b0;
      auVar8 = local_1b8;
      local_1b8 = (undefined1  [8])0x0;
      p_Stack_1b0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      if (p_Var16 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var16);
      }
      if (p_Stack_1b0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_1b0);
      }
      if (local_198 != &local_188) {
        operator_delete(local_198,
                        (ulong)((long)&(local_188->super_StuntDouble)._vptr_StuntDouble + 1));
      }
      if (auVar8 == (undefined1  [8])0x0) {
        builtin_strncpy(painCave.errMsg + 0x23,"edObject\n",10);
        builtin_strncpy(painCave.errMsg + 0x10,"traint for Restrain",0x13);
        builtin_strncpy(painCave.errMsg,"Can not find Res",0x10);
        painCave.isFatal = 1;
        painCave.severity = 1;
        simError();
      }
      else {
        lVar11 = __dynamic_cast(auVar8,&GenericData::typeinfo,
                                &SimpleTypeData<OpenMD::Restraint*>::typeinfo,0);
        lVar15 = 0;
        p_Var16 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        if ((lVar11 != 0) &&
           (lVar15 = lVar11, p_Var16 = this_00,
           this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            this_00->_M_use_count = this_00->_M_use_count + 1;
            UNLOCK();
          }
          else {
            this_00->_M_use_count = this_00->_M_use_count + 1;
          }
        }
        if (lVar15 == 0) {
          builtin_strncpy(painCave.errMsg + 0x23,"ntData\n",8);
          builtin_strncpy(painCave.errMsg + 0x10,"ericData to Restrai",0x13);
          builtin_strncpy(painCave.errMsg,"Can not cast Gen",0x10);
          painCave.isFatal = 1;
          painCave.severity = 1;
          simError();
        }
        else {
          if (*(long *)(lVar15 + 0x28) == 0) {
            local_1c8 = (MolecularRestraint *)0x0;
          }
          else {
            local_1c8 = (MolecularRestraint *)
                        __dynamic_cast(*(long *)(lVar15 + 0x28),&Restraint::typeinfo,
                                       &MolecularRestraint::typeinfo,0);
          }
          if (local_1c8 == (MolecularRestraint *)0x0) {
            builtin_strncpy(painCave.errMsg,"Can not cast RestraintData to MolecularRestraint\n",
                            0x32);
            painCave.isFatal = 1;
            painCave.severity = 1;
            simError();
            local_1c8 = (MolecularRestraint *)0x0;
          }
        }
        if (p_Var16 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var16);
        }
      }
      Molecule::getCom((Vector3d *)local_1b8,*ppMVar20);
      local_148[0] = (pointer)0x0;
      local_148[1] = (pointer)0x0;
      local_148[2] = (pointer)0x0;
      pMVar12 = *ppMVar20;
      ppSVar17 = (pMVar12->integrableObjects_).
                 super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      while( true ) {
        if (ppSVar17 ==
            (pMVar12->integrableObjects_).
            super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
            _M_impl.super__Vector_impl_data._M_finish) {
          pSVar13 = (StuntDouble *)0x0;
        }
        else {
          pSVar13 = *ppSVar17;
        }
        if (pSVar13 == (StuntDouble *)0x0) break;
        psVar14 = (string *)
                  ((long)pSVar13->localIndex_ * 0x18 +
                  *(long *)((long)&(pSVar13->snapshotMan_->currentSnapshot_->atomData).position.
                                   super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start + pSVar13->storage_));
        local_198 = (Atom **)0x0;
        ppBStack_190 = (pointer)0x0;
        local_188 = (Atom *)0x0;
        if (psVar14 != (string *)&local_198) {
          lVar15 = 0;
          do {
            (&local_198)[lVar15] = *(Atom ***)(psVar14 + lVar15 * 8);
            lVar15 = lVar15 + 1;
          } while (lVar15 != 3);
        }
        std::vector<OpenMD::Vector3<double>,std::allocator<OpenMD::Vector3<double>>>::
        emplace_back<OpenMD::Vector3<double>>
                  ((vector<OpenMD::Vector3<double>,std::allocator<OpenMD::Vector3<double>>> *)
                   local_148,(Vector3<double> *)&local_198);
        pMVar12 = *ppMVar20;
        ppSVar17 = ppSVar17 + 1;
      }
      (local_1c8->super_Restraint).scaleFactor_ = (RealType)local_130;
      std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::vector
                (&local_f0,
                 (vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)
                 local_148);
      local_98.super_Vector<double,_3U>.data_[2] = (double)local_1a8;
      local_98.super_Vector<double,_3U>.data_[0] = (double)local_1b8;
      local_98.super_Vector<double,_3U>.data_[1] = (double)p_Stack_1b0;
      MolecularRestraint::calcForce(local_1c8,&local_f0,&local_98);
      if (local_f0.
          super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_f0.
                        super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_f0.
                              super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_f0.
                              super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::vector
                ((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)
                 &local_198,&local_1c8->forces_);
      pAVar10 = local_188;
      ppAVar9 = local_198;
      ppSVar17 = ((*ppMVar20)->integrableObjects_).
                 super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      ppAVar7 = local_198;
      this = local_150;
      if (ppSVar17 ==
          ((*ppMVar20)->integrableObjects_).
          super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        pSVar13 = (StuntDouble *)0x0;
      }
      else {
        pSVar13 = *ppSVar17;
      }
      while (local_150 = this, pSVar13 != (StuntDouble *)0x0) {
        pSVar6 = pSVar13->snapshotMan_->currentSnapshot_;
        lVar15 = (long)pSVar13->localIndex_ * 0x18;
        lVar11 = *(long *)((long)&(pSVar6->atomData).force.
                                  super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start + pSVar13->storage_) +
                 lVar15;
        lVar18 = 0;
        do {
          *(double *)(lVar11 + lVar18 * 8) =
               (double)ppAVar7[lVar18] + *(double *)(lVar11 + lVar18 * 8);
          lVar18 = lVar18 + 1;
        } while (lVar18 != 3);
        psVar14 = (string *)
                  (lVar15 + *(long *)((long)&(pSVar6->atomData).position.
                                             super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start +
                                     pSVar13->storage_));
        local_198 = (Atom **)0x0;
        ppBStack_190 = (pointer)0x0;
        local_188 = (Atom *)0x0;
        if (psVar14 != (string *)&local_198) {
          lVar15 = 0;
          do {
            (&local_198)[lVar15] = *(Atom ***)(psVar14 + lVar15 * 8);
            lVar15 = lVar15 + 1;
          } while (lVar15 != 3);
        }
        std::vector<OpenMD::Vector3<double>,std::allocator<OpenMD::Vector3<double>>>::
        emplace_back<OpenMD::Vector3<double>>
                  ((vector<OpenMD::Vector3<double>,std::allocator<OpenMD::Vector3<double>>> *)
                   local_148,(Vector3<double> *)&local_198);
        ppSVar17 = ppSVar17 + 1;
        if (ppSVar17 ==
            ((*ppMVar20)->integrableObjects_).
            super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
            _M_impl.super__Vector_impl_data._M_finish) {
          pSVar13 = (StuntDouble *)0x0;
        }
        else {
          pSVar13 = *ppSVar17;
        }
        ppAVar7 = ppAVar7 + 3;
        this = local_150;
      }
      this->unscaledPotential_ = (local_1c8->super_Restraint).pot_ + this->unscaledPotential_;
      if ((local_1c8->super_Restraint).printRest_ == true) {
        std::
        _Rb_tree<int,_std::pair<const_int,_std::pair<double,_double>_>,_std::_Select1st<std::pair<const_int,_std::pair<double,_double>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<double,_double>_>_>_>
        ::_Rb_tree((_Rb_tree<int,_std::pair<const_int,_std::pair<double,_double>_>,_std::_Select1st<std::pair<const_int,_std::pair<double,_double>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<double,_double>_>_>_>
                    *)&local_198,&(local_1c8->super_Restraint).restInfo_._M_t);
        std::
        _Rb_tree<int,_std::pair<const_int,_std::pair<double,_double>_>,_std::_Select1st<std::pair<const_int,_std::pair<double,_double>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<double,_double>_>_>_>
        ::clear(&local_120);
        if (local_188 != (Atom *)0x0) {
          local_120._M_impl.super__Rb_tree_header._M_header._M_color = (_Rb_tree_color)ppBStack_190;
          local_120._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)local_188;
          local_120._M_impl.super__Rb_tree_header._M_header._M_left = local_180;
          local_120._M_impl.super__Rb_tree_header._M_header._M_right = p_Stack_178;
          *(_Rb_tree_header **)&(local_188->super_StuntDouble).objType_ =
               &local_120._M_impl.super__Rb_tree_header;
          local_120._M_impl.super__Rb_tree_header._M_node_count = (size_t)local_170;
          local_188 = (Atom *)0x0;
          local_180 = (_Base_ptr)&ppBStack_190;
          local_170 = (pointer)0x0;
          p_Stack_178 = local_180;
        }
        std::
        _Rb_tree<int,_std::pair<const_int,_std::pair<double,_double>_>,_std::_Select1st<std::pair<const_int,_std::pair<double,_double>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<double,_double>_>_>_>
        ::~_Rb_tree((_Rb_tree<int,_std::pair<const_int,_std::pair<double,_double>_>,_std::_Select1st<std::pair<const_int,_std::pair<double,_double>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<double,_double>_>_>_>
                     *)&local_198);
        std::
        vector<std::map<int,_std::pair<double,_double>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<double,_double>_>_>_>,_std::allocator<std::map<int,_std::pair<double,_double>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<double,_double>_>_>_>_>_>
        ::push_back(local_128,(value_type *)&local_120);
      }
      if (ppAVar9 != (Atom **)0x0) {
        operator_delete(ppAVar9,(long)pAVar10 - (long)ppAVar9);
      }
      if (local_148[0] != (pointer)0x0) {
        operator_delete(local_148[0],(long)local_148[2] - (long)local_148[0]);
      }
      ppMVar20 = ppMVar20 + 1;
      p_Var16 = this_00;
    } while (ppMVar20 !=
             (this->restrainedMols_).
             super__Vector_base<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  ppSVar17 = (this->restrainedObjs_).
             super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  if (ppSVar17 !=
      (this->restrainedObjs_).
      super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    this_01 = (ObjectRestraint *)0x0;
    p_Var16 = this_00;
    do {
      pSVar13 = *ppSVar17;
      local_198 = &local_188;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_198,"Restraint","");
      StuntDouble::getPropertyByName((StuntDouble *)local_1b8,(string *)pSVar13);
      this_00 = p_Stack_1b0;
      auVar8 = local_1b8;
      local_1b8 = (undefined1  [8])0x0;
      p_Stack_1b0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      if (p_Var16 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var16);
      }
      if (p_Stack_1b0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_1b0);
      }
      if (local_198 != &local_188) {
        operator_delete(local_198,
                        (ulong)((long)&(local_188->super_StuntDouble)._vptr_StuntDouble + 1));
      }
      if (auVar8 == (undefined1  [8])0x0) {
        builtin_strncpy(painCave.errMsg + 0x23,"edObject\n",10);
        builtin_strncpy(painCave.errMsg + 0x10,"traint for Restrain",0x13);
        builtin_strncpy(painCave.errMsg,"Can not find Res",0x10);
        painCave.isFatal = 1;
        painCave.severity = 1;
        simError();
      }
      else {
        lVar11 = __dynamic_cast(auVar8,&GenericData::typeinfo,
                                &SimpleTypeData<OpenMD::Restraint*>::typeinfo,0);
        lVar15 = 0;
        p_Var16 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        if ((lVar11 != 0) &&
           (lVar15 = lVar11, p_Var16 = this_00,
           this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            this_00->_M_use_count = this_00->_M_use_count + 1;
            UNLOCK();
          }
          else {
            this_00->_M_use_count = this_00->_M_use_count + 1;
          }
        }
        if (lVar15 == 0) {
          builtin_strncpy(painCave.errMsg + 0x23,"ntData\n",8);
          builtin_strncpy(painCave.errMsg + 0x10,"ericData to Restrai",0x13);
          builtin_strncpy(painCave.errMsg,"Can not cast Gen",0x10);
          painCave.isFatal = 1;
          painCave.severity = 1;
          simError();
        }
        else {
          if (*(long *)(lVar15 + 0x28) == 0) {
            this_01 = (ObjectRestraint *)0x0;
          }
          else {
            this_01 = (ObjectRestraint *)
                      __dynamic_cast(*(long *)(lVar15 + 0x28),&Restraint::typeinfo,
                                     &ObjectRestraint::typeinfo,0);
          }
          if (this_01 == (ObjectRestraint *)0x0) {
            builtin_strncpy(painCave.errMsg + 0x23,"tRestraint\n",0xc);
            builtin_strncpy(painCave.errMsg + 0x10,"traintData to Objec",0x13);
            builtin_strncpy(painCave.errMsg,"Can not cast Res",0x10);
            painCave.isFatal = 1;
            painCave.severity = 1;
            simError();
            this_01 = (ObjectRestraint *)0x0;
          }
        }
        if (p_Var16 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var16);
        }
      }
      (this_01->super_Restraint).scaleFactor_ = (RealType)local_130;
      pSVar13 = *ppSVar17;
      lVar11 = (long)pSVar13->localIndex_;
      lVar15 = *(long *)((long)&(pSVar13->snapshotMan_->currentSnapshot_->atomData).position.
                                super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                ._M_impl.super__Vector_impl_data._M_start + pSVar13->storage_);
      local_1a8 = *(pointer *)(lVar15 + 0x10 + lVar11 * 0x18);
      plVar1 = (long *)(lVar15 + lVar11 * 0x18);
      local_1b8 = (undefined1  [8])*plVar1;
      p_Stack_1b0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar1[1];
      if (pSVar13->objType_ - otDAtom < 2) {
        StuntDouble::getA((RotMat3x3d *)&local_198,*ppSVar17);
        local_b8.super_Vector<double,_3U>.data_[2] = (double)local_1a8;
        local_b8.super_Vector<double,_3U>.data_[0] = (double)local_1b8;
        local_b8.super_Vector<double,_3U>.data_[1] = (double)p_Stack_1b0;
        psVar14 = (string *)&local_198;
        pRVar19 = &local_78;
        for (lVar15 = 9; lVar15 != 0; lVar15 = lVar15 + -1) {
          (pRVar19->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[0][0] =
               *(double *)psVar14;
          psVar14 = psVar14 + (ulong)bVar21 * -0x10 + 8;
          pRVar19 = (RotMat3x3d *)((long)pRVar19 + ((ulong)bVar21 * -2 + 1) * 8);
        }
        ObjectRestraint::calcForce(this_01,&local_b8,&local_78);
        pSVar13 = *ppSVar17;
        local_148[2] = (pointer)(this_01->force_).super_Vector<double,_3U>.data_[2];
        local_148[0] = (pointer)(this_01->force_).super_Vector<double,_3U>.data_[0];
        local_148[1] = (pointer)(this_01->force_).super_Vector<double,_3U>.data_[1];
        lVar15 = (long)pSVar13->localIndex_ * 0x18 +
                 *(long *)((long)&(pSVar13->snapshotMan_->currentSnapshot_->atomData).force.
                                  super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start + pSVar13->storage_);
        lVar11 = 0;
        do {
          *(double *)(lVar15 + lVar11 * 8) =
               (double)local_148[lVar11] + *(double *)(lVar15 + lVar11 * 8);
          lVar11 = lVar11 + 1;
        } while (lVar11 != 3);
        pSVar13 = *ppSVar17;
        local_148[2] = (pointer)(this_01->torque_).super_Vector<double,_3U>.data_[2];
        local_148[0] = (pointer)(this_01->torque_).super_Vector<double,_3U>.data_[0];
        local_148[1] = (pointer)(this_01->torque_).super_Vector<double,_3U>.data_[1];
        lVar15 = (long)pSVar13->localIndex_ * 0x18 +
                 *(long *)((long)&(pSVar13->snapshotMan_->currentSnapshot_->atomData).torque.
                                  super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start + pSVar13->storage_);
        lVar11 = 0;
        do {
          *(double *)(lVar15 + lVar11 * 8) =
               (double)local_148[lVar11] + *(double *)(lVar15 + lVar11 * 8);
          lVar11 = lVar11 + 1;
        } while (lVar11 != 3);
      }
      else {
        puVar2 = (undefined8 *)(lVar15 + lVar11 * 0x18);
        local_d8.super_Vector<double,_3U>.data_[0] = (double)*puVar2;
        local_d8.super_Vector<double,_3U>.data_[1] = (double)puVar2[1];
        local_d8.super_Vector<double,_3U>.data_[2] = (double)puVar2[2];
        ObjectRestraint::calcForce(this_01,&local_d8);
        pSVar13 = *ppSVar17;
        local_188 = (Atom *)(this_01->force_).super_Vector<double,_3U>.data_[2];
        local_198 = (Atom **)(this_01->force_).super_Vector<double,_3U>.data_[0];
        ppBStack_190 = (pointer)(this_01->force_).super_Vector<double,_3U>.data_[1];
        lVar15 = (long)pSVar13->localIndex_ * 0x18 +
                 *(long *)((long)&(pSVar13->snapshotMan_->currentSnapshot_->atomData).force.
                                  super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start + pSVar13->storage_);
        lVar11 = 0;
        do {
          *(double *)(lVar15 + lVar11 * 8) =
               (double)(&local_198)[lVar11] + *(double *)(lVar15 + lVar11 * 8);
          lVar11 = lVar11 + 1;
        } while (lVar11 != 3);
      }
      local_150->unscaledPotential_ =
           (this_01->super_Restraint).pot_ + local_150->unscaledPotential_;
      if ((this_01->super_Restraint).printRest_ == true) {
        std::
        _Rb_tree<int,_std::pair<const_int,_std::pair<double,_double>_>,_std::_Select1st<std::pair<const_int,_std::pair<double,_double>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<double,_double>_>_>_>
        ::_Rb_tree((_Rb_tree<int,_std::pair<const_int,_std::pair<double,_double>_>,_std::_Select1st<std::pair<const_int,_std::pair<double,_double>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<double,_double>_>_>_>
                    *)&local_198,&(this_01->super_Restraint).restInfo_._M_t);
        std::
        _Rb_tree<int,_std::pair<const_int,_std::pair<double,_double>_>,_std::_Select1st<std::pair<const_int,_std::pair<double,_double>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<double,_double>_>_>_>
        ::clear(&local_120);
        if (local_188 != (Atom *)0x0) {
          local_120._M_impl.super__Rb_tree_header._M_header._M_color = (_Rb_tree_color)ppBStack_190;
          local_120._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)local_188;
          local_120._M_impl.super__Rb_tree_header._M_header._M_left = local_180;
          local_120._M_impl.super__Rb_tree_header._M_header._M_right = p_Stack_178;
          *(_Rb_tree_header **)&(local_188->super_StuntDouble).objType_ =
               &local_120._M_impl.super__Rb_tree_header;
          local_120._M_impl.super__Rb_tree_header._M_node_count = (size_t)local_170;
          local_188 = (Atom *)0x0;
          local_180 = (_Base_ptr)&ppBStack_190;
          local_170 = (pointer)0x0;
          p_Stack_178 = local_180;
        }
        std::
        _Rb_tree<int,_std::pair<const_int,_std::pair<double,_double>_>,_std::_Select1st<std::pair<const_int,_std::pair<double,_double>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<double,_double>_>_>_>
        ::~_Rb_tree((_Rb_tree<int,_std::pair<const_int,_std::pair<double,_double>_>,_std::_Select1st<std::pair<const_int,_std::pair<double,_double>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<double,_double>_>_>_>
                     *)&local_198);
        std::
        vector<std::map<int,_std::pair<double,_double>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<double,_double>_>_>_>,_std::allocator<std::map<int,_std::pair<double,_double>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<double,_double>_>_>_>_>_>
        ::push_back(local_128,(value_type *)&local_120);
      }
      ppSVar17 = ppSVar17 + 1;
      p_Var16 = this_00;
    } while (ppSVar17 !=
             (local_150->restrainedObjs_).
             super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
             _M_impl.super__Vector_impl_data._M_finish);
  }
  dVar3 = local_150->unscaledPotential_;
  std::
  _Rb_tree<int,_std::pair<const_int,_std::pair<double,_double>_>,_std::_Select1st<std::pair<const_int,_std::pair<double,_double>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<double,_double>_>_>_>
  ::~_Rb_tree(&local_120);
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  return dVar3 * (double)local_130;
}

Assistant:

RealType RestraintForceModifier::doRestraints(RealType scalingFactor) {
    std::vector<Molecule*>::const_iterator rm;
    std::shared_ptr<GenericData> data;
    Molecule::IntegrableObjectIterator ioi;
    MolecularRestraint* mRest = NULL;
    ObjectRestraint* oRest    = NULL;
    StuntDouble* sd;

    std::vector<StuntDouble*>::const_iterator ro;

    std::map<int, Restraint::RealPair> restInfo;

    unscaledPotential_ = 0.0;

    restInfo_.clear();

    for (rm = restrainedMols_.begin(); rm != restrainedMols_.end(); ++rm) {
      // make sure this molecule (*rm) has a generic data for restraints:
      data = (*rm)->getPropertyByName("Restraint");
      if (data != nullptr) {
        // make sure we can reinterpret the generic data as restraint data:
        std::shared_ptr<RestraintData> restData =
            std::dynamic_pointer_cast<RestraintData>(data);
        if (restData != nullptr) {
          // make sure we can reinterpet the restraint data as a
          // MolecularRestraint
          mRest = dynamic_cast<MolecularRestraint*>(restData->getData());
          if (mRest == NULL) {
            snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                     "Can not cast RestraintData to MolecularRestraint\n");
            painCave.severity = OPENMD_ERROR;
            painCave.isFatal  = 1;
            simError();
          }
        } else {
          snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                   "Can not cast GenericData to RestraintData\n");
          painCave.severity = OPENMD_ERROR;
          painCave.isFatal  = 1;
          simError();
        }
      } else {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "Can not find Restraint for RestrainedObject\n");
        painCave.severity = OPENMD_ERROR;
        painCave.isFatal  = 1;
        simError();
      }

      // phew.  At this point, we should have the pointer to the
      // correct MolecularRestraint in the variable mRest.

      Vector3d molCom = (*rm)->getCom();

      std::vector<Vector3d> struc;
      std::vector<Vector3d> forces;

      for (sd = (*rm)->beginIntegrableObject(ioi); sd != NULL;
           sd = (*rm)->nextIntegrableObject(ioi)) {
        struc.push_back(sd->getPos());
      }

      mRest->setScaleFactor(scalingFactor);
      mRest->calcForce(struc, molCom);
      forces    = mRest->getRestraintForces();
      int index = 0;

      for (sd = (*rm)->beginIntegrableObject(ioi); sd != NULL;
           sd = (*rm)->nextIntegrableObject(ioi)) {
        sd->addFrc(forces[index]);
        struc.push_back(sd->getPos());
        index++;
      }

      unscaledPotential_ += mRest->getUnscaledPotential();

      // only collect data on restraints that we're going to print:
      if (mRest->getPrintRestraint()) {
        restInfo = mRest->getRestraintInfo();
        restInfo_.push_back(restInfo);
      }
    }

    for (ro = restrainedObjs_.begin(); ro != restrainedObjs_.end(); ++ro) {
      // make sure this object (*ro) has a generic data for restraints:
      data = (*ro)->getPropertyByName("Restraint");
      if (data != NULL) {
        // make sure we can reinterpret the generic data as restraint data:
        std::shared_ptr<RestraintData> restData =
            std::dynamic_pointer_cast<RestraintData>(data);
        if (restData != nullptr) {
          // make sure we can reinterpet the restraint data as a pointer to
          // an ObjectRestraint:
          oRest = dynamic_cast<ObjectRestraint*>(restData->getData());
          if (oRest == NULL) {
            snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                     "Can not cast RestraintData to ObjectRestraint\n");
            painCave.severity = OPENMD_ERROR;
            painCave.isFatal  = 1;
            simError();
          }
        } else {
          snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                   "Can not cast GenericData to RestraintData\n");
          painCave.severity = OPENMD_ERROR;
          painCave.isFatal  = 1;
          simError();
        }
      } else {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "Can not find Restraint for RestrainedObject\n");
        painCave.severity = OPENMD_ERROR;
        painCave.isFatal  = 1;
        simError();
      }

      // phew.  At this point, we should have the pointer to the
      // correct Object restraint in the variable oRest.
      oRest->setScaleFactor(scalingFactor);

      Vector3d pos = (*ro)->getPos();

      if ((*ro)->isDirectional()) {
        // directional objects may have orientational restraints as well
        // as positional, so get the rotation matrix first:

        RotMat3x3d A = (*ro)->getA();
        oRest->calcForce(pos, A);
        (*ro)->addFrc(oRest->getRestraintForce());
        (*ro)->addTrq(oRest->getRestraintTorque());

      } else {
        // plain vanilla positional restraints:

        oRest->calcForce(pos);
        (*ro)->addFrc(oRest->getRestraintForce());
      }

      unscaledPotential_ += oRest->getUnscaledPotential();

      // only collect data on restraints that we're going to print:
      if (oRest->getPrintRestraint()) {
        restInfo = oRest->getRestraintInfo();
        restInfo_.push_back(restInfo);
      }
    }

    return unscaledPotential_ * scalingFactor;
  }